

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O3

cmBTStringRange __thiscall
cmStateDirectory::GetLinkDirectoriesEntries_abi_cxx11_(cmStateDirectory *this)

{
  PointerType pBVar1;
  PointerType pSVar2;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var3;
  cmBTStringRange cVar4;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_28;
  pointer local_20;
  pointer local_18;
  
  pBVar1 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&(this->Snapshot_).Position);
  local_20 = (pBVar1->LinkDirectories).
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  _Var3._M_current = local_20 + pSVar2->LinkDirectoriesPosition;
  local_18 = _Var3._M_current;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
            (&local_28,&local_18,&local_20,&::cmPropertySentinal_abi_cxx11_);
  cVar4.End._M_current = _Var3._M_current;
  cVar4.Begin._M_current = local_28._M_current;
  return cVar4;
}

Assistant:

cmBTStringRange cmStateDirectory::GetLinkDirectoriesEntries() const
{
  return GetPropertyContent(this->DirectoryState->LinkDirectories,
                            this->Snapshot_.Position->LinkDirectoriesPosition);
}